

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fIndexedStateQueryTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::BlendEquationAdvancedCase::iterate
          (BlendEquationAdvancedCase *this)

{
  GLenum *pGVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  GLenum *pGVar3;
  TestLog *pTVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  GLenum err;
  undefined4 extraout_var;
  GLuint buf;
  undefined4 *puVar8;
  undefined *puVar9;
  ulong uVar10;
  ulong uVar11;
  deInt32 maxDrawBuffers;
  ScopedLogSection section;
  CallLogWrapper gl;
  ResultCollector result;
  GLint local_e4;
  ScopedLogSection local_e0;
  string local_d8;
  string local_b8;
  CallLogWrapper local_98;
  ResultCollector local_80;
  
  iVar7 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_98,(Functions *)CONCAT44(extraout_var,iVar7),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_80,pTVar4,&local_d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  local_e4 = 0;
  local_98.m_enableLog = true;
  glu::CallLogWrapper::glGetIntegerv(&local_98,0x8824,&local_e4);
  err = glu::CallLogWrapper::glGetError(&local_98);
  glu::checkError(err,"glGetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fIndexedStateQueryTests.cpp"
                  ,0x575);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingCommon","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar4,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glBlendEquation(&local_98,0x9295);
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar7,0x9295,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x883d,iVar7,0x9295,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"AfterSettingIndexed","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"After setting indexed","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar4,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    puVar8 = &DAT_01ca0b50;
    uVar10 = 0;
    do {
      glu::CallLogWrapper::glBlendEquationi(&local_98,(GLuint)uVar10,puVar8[(uVar10 / 0xf) * -0xf]);
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 1;
    } while ((int)uVar10 < local_e4);
  }
  if (0 < local_e4) {
    puVar8 = &DAT_01ca0b50;
    uVar10 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,(int)uVar10,puVar8[(uVar10 / 0xf) * -0xf],
                 this->m_verifierType);
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 1;
    } while ((int)uVar10 < local_e4);
  }
  if (0 < local_e4) {
    puVar8 = &DAT_01ca0b50;
    uVar10 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x883d,(int)uVar10,puVar8[(uVar10 / 0xf) * -0xf],
                 this->m_verifierType);
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 1;
    } while ((int)uVar10 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  paVar2 = &local_d8.field_2;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedWithCommon","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After resetting indexed with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar4,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  if (0 < local_e4) {
    puVar8 = &DAT_01ca0b50;
    uVar10 = 0;
    do {
      glu::CallLogWrapper::glBlendEquationi(&local_98,(GLuint)uVar10,puVar8[(uVar10 / 0xf) * -0xf]);
      uVar10 = uVar10 + 1;
      puVar8 = puVar8 + 1;
    } while ((int)uVar10 < local_e4);
  }
  glu::CallLogWrapper::glBlendEquation(&local_98,0x9294);
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar7,0x9294,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x883d,iVar7,0x9294,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  pTVar4 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_d8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"AfterResettingIndexedSeparateWithCommon","");
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b8,"After resetting indexed separate with common","");
  tcu::ScopedLogSection::ScopedLogSection(&local_e0,pTVar4,&local_d8,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != paVar2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  puVar8 = &DAT_01ca0b30;
  puVar9 = &DAT_01ca0b34;
  uVar11 = 1;
  uVar10 = 0;
  while( true ) {
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar10;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar11;
    buf = (GLuint)uVar10;
    if (local_e4 <= (int)buf) break;
    pGVar1 = (GLenum *)
             ((long)puVar8 +
             (SUB168(auVar5 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    uVar10 = uVar10 + 1;
    pGVar3 = (GLenum *)
             (puVar9 + (SUB168(auVar6 * ZEXT816(0xcccccccccccccccd),8) & 0xfffffffffffffffc) * -5);
    puVar8 = puVar8 + 1;
    puVar9 = puVar9 + 4;
    uVar11 = uVar11 + 1;
    glu::CallLogWrapper::glBlendEquationSeparatei(&local_98,buf,*pGVar1,*pGVar3);
  }
  glu::CallLogWrapper::glBlendEquation(&local_98,0x9298);
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x8009,iVar7,0x9298,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  if (0 < local_e4) {
    iVar7 = 0;
    do {
      deqp::gls::StateQueryUtil::verifyStateIndexedInteger
                (&local_80,&local_98,0x883d,iVar7,0x9298,this->m_verifierType);
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_e4);
  }
  tcu::TestLog::endSection(local_e0.m_log);
  tcu::ResultCollector::setTestContextResult
            (&local_80,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_98);
  return STOP;
}

Assistant:

BlendEquationAdvancedCase::IterateResult BlendEquationAdvancedCase::iterate (void)
{
	const deUint32 blendEquations[] =
	{
		GL_FUNC_ADD,
		GL_FUNC_SUBTRACT,
		GL_FUNC_REVERSE_SUBTRACT,
		GL_MIN,
		GL_MAX
	};

	const deUint32 blendEquationAdvanced[] =
	{
		GL_MULTIPLY,
		GL_SCREEN,
		GL_OVERLAY,
		GL_DARKEN,
		GL_LIGHTEN,
		GL_COLORDODGE,
		GL_COLORBURN,
		GL_HARDLIGHT,
		GL_SOFTLIGHT,
		GL_DIFFERENCE,
		GL_EXCLUSION,
		GL_HSL_HUE,
		GL_HSL_SATURATION,
		GL_HSL_COLOR,
		GL_HSL_LUMINOSITY
	};

	glu::CallLogWrapper		gl				(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result			(m_testCtx.getLog(), " // ERROR: ");
	deInt32					maxDrawBuffers = 0;

	gl.enableLogging(true);

	gl.glGetIntegerv(GL_MAX_DRAW_BUFFERS, &maxDrawBuffers);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "glGetIntegerv");

	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingCommon", "After setting common");

		gl.glBlendEquation(GL_SCREEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_SCREEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_SCREEN, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterSettingIndexed", "After setting indexed");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)], m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedWithCommon", "After resetting indexed with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationi(ndx, blendEquationAdvanced[ndx % DE_LENGTH_OF_ARRAY(blendEquationAdvanced)]);

		gl.glBlendEquation(GL_MULTIPLY);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_MULTIPLY, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_MULTIPLY, m_verifierType);
	}
	{
		const tcu::ScopedLogSection section (m_testCtx.getLog(), "AfterResettingIndexedSeparateWithCommon", "After resetting indexed separate with common");

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			gl.glBlendEquationSeparatei(ndx, blendEquations[ndx % DE_LENGTH_OF_ARRAY(blendEquations)], blendEquations[(ndx + 1) % DE_LENGTH_OF_ARRAY(blendEquations)]);

		gl.glBlendEquation(GL_LIGHTEN);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_RGB, ndx, GL_LIGHTEN, m_verifierType);

		for (int ndx = 0; ndx < maxDrawBuffers; ++ndx)
			verifyStateIndexedInteger(result, gl, GL_BLEND_EQUATION_ALPHA, ndx, GL_LIGHTEN, m_verifierType);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}